

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

void __thiscall
flatbuffers::rust::RustGenerator::GenNamespaceImports(RustGenerator *this,int white_spaces)

{
  CodeWriter *this_00;
  _Base_ptr p_Var1;
  string *this_01;
  Parser *pPVar2;
  string indent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string prefix;
  string basename;
  string noext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  std::__cxx11::string::_M_construct((ulong)&indent,(char)white_spaces);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"",(allocator<char> *)&noext);
  this_00 = &this->code_;
  CodeWriter::operator+=(this_00,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  pPVar2 = (this->super_BaseGenerator).parser_;
  if ((pPVar2->opts).generate_all == false) {
    for (p_Var1 = (pPVar2->included_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(pPVar2->included_files_)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      if (p_Var1[1]._M_left != (_Base_ptr)0x0) {
        StripExtension(&noext,(string *)&p_Var1[1]._M_parent);
        StripPath(&basename,&noext);
        pPVar2 = (this->super_BaseGenerator).parser_;
        if ((pPVar2->opts).include_prefix._M_string_length == 0) {
          std::operator+(&local_290,&indent,"use crate::");
          std::operator+(&local_270,&local_290,&basename);
          std::operator+(&prefix,&local_270,
                         &(((this->super_BaseGenerator).parser_)->opts).filename_suffix);
          std::operator+(&local_50,&prefix,"::*;");
          CodeWriter::operator+=(this_00,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&prefix);
          std::__cxx11::string::~string((string *)&local_270);
          this_01 = &local_290;
        }
        else {
          std::__cxx11::string::string((string *)&prefix,(string *)&(pPVar2->opts).include_prefix);
          std::__cxx11::string::pop_back();
          std::operator+(&local_d0,&indent,"use crate::");
          std::operator+(&local_b0,&local_d0,&prefix);
          std::operator+(&local_90,&local_b0,"::");
          std::operator+(&local_290,&local_90,&basename);
          std::operator+(&local_270,&local_290,
                         &(((this->super_BaseGenerator).parser_)->opts).filename_suffix);
          std::operator+(&local_70,&local_270,"::*;");
          CodeWriter::operator+=(this_00,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_290);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d0);
          this_01 = &prefix;
        }
        std::__cxx11::string::~string((string *)this_01);
        std::__cxx11::string::~string((string *)&basename);
        std::__cxx11::string::~string((string *)&noext);
        pPVar2 = (this->super_BaseGenerator).parser_;
      }
    }
  }
  std::operator+(&local_110,&indent,"use core::mem;");
  CodeWriter::operator+=(this_00,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::operator+(&local_130,&indent,"use core::cmp::Ordering;");
  CodeWriter::operator+=(this_00,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"",(allocator<char> *)&noext);
  CodeWriter::operator+=(this_00,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  if ((((this->super_BaseGenerator).parser_)->opts).rust_serialize == true) {
    std::operator+(&local_170,&indent,"extern crate serde;");
    CodeWriter::operator+=(this_00,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::operator+(&local_190,&indent,
                   "use self::serde::ser::{Serialize, Serializer, SerializeStruct};");
    CodeWriter::operator+=(this_00,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"",(allocator<char> *)&noext);
    CodeWriter::operator+=(this_00,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  std::operator+(&local_1d0,&indent,"extern crate flatbuffers;");
  CodeWriter::operator+=(this_00,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::operator+(&local_1f0,&indent,"use self::flatbuffers::{EndianScalar, Follow};");
  CodeWriter::operator+=(this_00,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&indent);
  return;
}

Assistant:

void GenNamespaceImports(const int white_spaces) {
    // DO not use global attributes (i.e. #![...]) since it interferes
    // with users who include! generated files.
    // See: https://github.com/google/flatbuffers/issues/6261
    std::string indent = std::string(white_spaces, ' ');
    code_ += "";
    if (!parser_.opts.generate_all) {
      for (auto it = parser_.included_files_.begin();
           it != parser_.included_files_.end(); ++it) {
        if (it->second.empty()) continue;
        auto noext = flatbuffers::StripExtension(it->second);
        auto basename = flatbuffers::StripPath(noext);

        if (parser_.opts.include_prefix.empty()) {
          code_ += indent + "use crate::" + basename +
                   parser_.opts.filename_suffix + "::*;";
        } else {
          auto prefix = parser_.opts.include_prefix;
          prefix.pop_back();

          code_ += indent + "use crate::" + prefix + "::" + basename +
                   parser_.opts.filename_suffix + "::*;";
        }
      }
    }
    code_ += indent + "use core::mem;";
    code_ += indent + "use core::cmp::Ordering;";
    code_ += "";
    if (parser_.opts.rust_serialize) {
      code_ += indent + "extern crate serde;";
      code_ +=
          indent +
          "use self::serde::ser::{Serialize, Serializer, SerializeStruct};";
      code_ += "";
    }
    code_ += indent + "extern crate flatbuffers;";
    code_ += indent + "use self::flatbuffers::{EndianScalar, Follow};";
  }